

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall Lodtalk::AST::ArgumentList::ArgumentList(ArgumentList *this,Argument *firstArgument)

{
  Argument *local_18;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__ArgumentList_00170118;
  (this->arguments).
  super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arguments).
  super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments).
  super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = firstArgument;
  std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>::push_back
            (&this->arguments,&local_18);
  return;
}

Assistant:

ArgumentList::ArgumentList(Argument *firstArgument)
{
	arguments.push_back(firstArgument);
}